

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O0

void setup_default_font_family_list(void)

{
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar1;
  allocator<char> local_1c9;
  value_type local_1c8;
  _Base_ptr local_1a8;
  undefined1 local_1a0;
  allocator<char> local_191;
  value_type local_190;
  _Base_ptr local_170;
  undefined1 local_168;
  allocator<char> local_159;
  value_type local_158;
  _Base_ptr local_138;
  undefined1 local_130;
  allocator<char> local_121;
  value_type local_120;
  _Base_ptr local_100;
  undefined1 local_f8;
  allocator<char> local_e9;
  value_type local_e8;
  _Base_ptr local_c8;
  undefined1 local_c0;
  allocator<char> local_b1;
  value_type local_b0;
  _Base_ptr local_90;
  undefined1 local_88;
  allocator<char> local_79;
  value_type local_78;
  _Base_ptr local_58;
  undefined1 local_50;
  allocator<char> local_31;
  value_type local_30;
  AutoMutex local_10;
  AutoMutex l;
  
  Kumu::AutoMutex::AutoMutex(&local_10,&sg_default_font_family_list_lock);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"default",&local_31);
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&sg_default_font_family_list_abi_cxx11_,&local_30);
  local_58 = (_Base_ptr)pVar1.first._M_node;
  local_50 = pVar1.second;
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"monospace",&local_79);
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&sg_default_font_family_list_abi_cxx11_,&local_78);
  local_90 = (_Base_ptr)pVar1.first._M_node;
  local_88 = pVar1.second;
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"sansSerif",&local_b1);
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&sg_default_font_family_list_abi_cxx11_,&local_b0);
  local_c8 = (_Base_ptr)pVar1.first._M_node;
  local_c0 = pVar1.second;
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"serif",&local_e9);
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&sg_default_font_family_list_abi_cxx11_,&local_e8);
  local_100 = (_Base_ptr)pVar1.first._M_node;
  local_f8 = pVar1.second;
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"monospaceSansSerif",&local_121);
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&sg_default_font_family_list_abi_cxx11_,&local_120);
  local_138 = (_Base_ptr)pVar1.first._M_node;
  local_130 = pVar1.second;
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"monospaceSerif",&local_159);
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&sg_default_font_family_list_abi_cxx11_,&local_158);
  local_170 = (_Base_ptr)pVar1.first._M_node;
  local_168 = pVar1.second;
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"proportionalSansSerif",&local_191);
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&sg_default_font_family_list_abi_cxx11_,&local_190);
  local_1a8 = (_Base_ptr)pVar1.first._M_node;
  local_1a0 = pVar1.second;
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"proportionalSerif",&local_1c9);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&sg_default_font_family_list_abi_cxx11_,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  Kumu::AutoMutex::~AutoMutex(&local_10);
  return;
}

Assistant:

static void
setup_default_font_family_list()
{
  AutoMutex l(sg_default_font_family_list_lock);
  sg_default_font_family_list.insert("default");
  sg_default_font_family_list.insert("monospace");
  sg_default_font_family_list.insert("sansSerif");
  sg_default_font_family_list.insert("serif");
  sg_default_font_family_list.insert("monospaceSansSerif");
  sg_default_font_family_list.insert("monospaceSerif");
  sg_default_font_family_list.insert("proportionalSansSerif");
  sg_default_font_family_list.insert("proportionalSerif");
}